

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Yolov3DetectionOutput_x86::forward
          (Yolov3DetectionOutput_x86 *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
  *this_00;
  undefined4 uVar2;
  ulong uVar3;
  pointer pMVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  iterator __position;
  Mat *this_01;
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined8 uVar13;
  undefined1 auVar14 [16];
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar15;
  int iVar16;
  float *pfVar17;
  undefined4 *puVar18;
  byte bVar19;
  int iVar20;
  BBoxRect *__args;
  float *pfVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  float *pfVar25;
  float *pfVar26;
  long lVar27;
  uint _h;
  float fVar28;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  local_1a8;
  long local_190;
  BBoxRect local_188;
  uint local_16c;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  local_168;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  ulong local_138;
  pointer local_130;
  ulong local_128;
  float *local_120;
  float *local_118;
  Yolov3DetectionOutput *local_110;
  float local_108;
  float fStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  float local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_e0;
  Option *local_d8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_d0;
  long local_c8;
  long local_c0;
  void *local_b8;
  ulong local_b0;
  ulong local_a8;
  void *local_a0;
  float *local_98;
  long local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [12];
  float fStack_5c;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_168.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0 = top_blobs;
  local_d8 = opt;
  if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar23 = 0;
    local_110 = &this->super_Yolov3DetectionOutput;
    local_d0 = bottom_blobs;
    do {
      pvVar15 = local_d0;
      local_1a8.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1a8.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1a8.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::resize(&local_1a8,(long)(this->super_Yolov3DetectionOutput).num_box);
      pMVar4 = (pvVar15->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar16 = pMVar4[uVar23].c / (this->super_Yolov3DetectionOutput).num_box;
      if (iVar16 != (this->super_Yolov3DetectionOutput).num_class + 5) {
        std::
        vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
        ::~vector(&local_1a8);
        iVar16 = -1;
        goto LAB_00482981;
      }
      local_138 = uVar23;
      if (0 < (this->super_Yolov3DetectionOutput).num_box) {
        local_130 = pMVar4 + uVar23;
        uVar3._0_4_ = local_130->w;
        uVar3._4_4_ = local_130->h;
        pvVar5 = (this->super_Yolov3DetectionOutput).anchors_scale.data;
        fVar28 = *(float *)((long)pvVar5 + uVar23 * 4);
        auVar32._4_4_ = -(uint)(0 < (int)(undefined4)uVar3);
        auVar32._0_4_ = -(uint)(0 < (int)(undefined4)uVar3);
        auVar32._8_4_ = -(uint)(0 < (int)uVar3._4_4_);
        auVar32._12_4_ = -(uint)(0 < (int)uVar3._4_4_);
        local_16c = movmskpd((int)pvVar5,auVar32);
        bVar19 = (byte)local_16c;
        local_88._0_4_ = (undefined4)(int)(fVar28 * (float)(int)(undefined4)uVar3);
        local_88._4_4_ = (undefined4)(int)(fVar28 * (float)(int)uVar3._4_4_);
        local_88._8_4_ = (float)(int)(fVar28 * 0.0);
        local_88._12_4_ = (float)(int)(fVar28 * 0.0);
        local_128 = uVar3 & 0xffffffff;
        local_c8 = (long)iVar16;
        local_b0 = (ulong)(uint)uVar3._4_4_;
        uVar9 = CONCAT44((float)(int)uVar3._4_4_,(float)(int)(undefined4)uVar3);
        local_68._8_4_ = 0x3f000000;
        local_68._0_8_ = uVar9;
        fStack_5c = 0.5;
        auVar10._8_4_ = 0x3f000000;
        auVar10._0_8_ = uVar9;
        auVar10._12_4_ = 0x3f000000;
        local_78 = divps(_DAT_005f0a60,auVar10);
        local_c0 = (long)(this->super_Yolov3DetectionOutput).num_box * uVar23 * 4;
        local_190 = 0;
        do {
          uVar23 = local_130->elemsize;
          if (bVar19 >> 1 != 0) {
            lVar24 = local_190 * local_c8;
            local_58._8_8_ =
                 *(undefined8 *)
                  ((long)(this->super_Yolov3DetectionOutput).biases.data +
                  (long)((int)*(float *)((long)(this->super_Yolov3DetectionOutput).mask.data +
                                        local_190 * 4 + local_c0) * 2) * 4);
            local_58._0_8_ = 0x3f8000003f800000;
            local_b8 = (void *)((lVar24 + 5) * local_130->cstep * uVar23 + (long)local_130->data);
            sVar6 = local_130->cstep;
            pvVar5 = local_130->data;
            sVar7 = local_130->elemsize;
            pfVar26 = (float *)((lVar24 + 4) * sVar6 * sVar7 + (long)pvVar5);
            local_118 = (float *)((lVar24 + 3) * sVar6 * sVar7 + (long)pvVar5);
            local_120 = (float *)((lVar24 + 2) * sVar6 * sVar7 + (long)pvVar5);
            pfVar21 = (float *)((lVar24 + 1) * sVar6 * sVar7 + (long)pvVar5);
            pfVar25 = (float *)(lVar24 * sVar6 * sVar7 + (long)pvVar5);
            iVar16 = (int)(((long)local_130->d * uVar23 * (long)local_130->h * (long)local_130->w +
                            0xf & 0xfffffffffffffff0) / uVar23);
            local_90 = (long)iVar16;
            uVar23 = 0;
            do {
              local_a8 = uVar23;
              if ((local_16c & 1) != 0) {
                local_48 = (float)(int)uVar23;
                local_a0 = (void *)((long)local_b8 + uVar23 * local_128 * 4);
                uStack_40 = local_88._0_4_;
                uStack_3c = local_88._4_4_;
                uVar23 = 0;
                fStack_44 = local_48;
                do {
                  lVar24 = (this->super_Yolov3DetectionOutput).num_class * local_90;
                  if ((int)lVar24 < 1) {
                    iVar22 = 0;
                    local_f8 = -3.4028235e+38;
                  }
                  else {
                    pfVar17 = (float *)((long)local_a0 + uVar23 * 4);
                    pfVar1 = pfVar17 + lVar24;
                    iVar22 = 0;
                    local_f8 = -3.4028235e+38;
                    iVar20 = 0;
                    do {
                      fVar28 = *pfVar17;
                      if (local_f8 < fVar28) {
                        iVar22 = iVar20;
                      }
                      if (local_f8 <= fVar28) {
                        local_f8 = fVar28;
                      }
                      pfVar17 = pfVar17 + iVar16;
                      iVar20 = iVar20 + 1;
                    } while (pfVar17 < pfVar1);
                  }
                  uStack_f4 = 0;
                  uStack_f0 = 0;
                  uStack_ec = 0;
                  local_148 = expf(-*pfVar26);
                  fVar28 = expf(-local_f8);
                  fVar28 = 1.0 / ((fVar28 + 1.0) * local_148 + 1.0);
                  if (local_110->confidence_threshold <= fVar28) {
                    local_108 = -*pfVar25;
                    fStack_104 = -*pfVar21;
                    uStack_100 = 0x80000000;
                    uStack_fc = 0x80000000;
                    local_f8 = fVar28;
                    local_98 = pfVar26;
                    local_148 = expf(local_108);
                    fStack_144 = extraout_XMM0_Db;
                    fVar28 = expf(fStack_104);
                    local_148 = local_148 + 1.0;
                    fStack_140 = fStack_144 + 0.0;
                    fStack_13c = extraout_XMM0_Db_00 + 0.0;
                    fStack_144 = fVar28 + 1.0;
                    local_108 = expf(*local_120);
                    fStack_104 = (float)extraout_XMM0_Db_01;
                    fVar28 = expf(*local_118);
                    local_188.score = local_f8;
                    auVar11._8_4_ = fStack_104;
                    auVar11._4_4_ = local_108;
                    auVar11._0_4_ = extraout_XMM0_Db_02;
                    auVar29._0_8_ = auVar11._0_8_ << 0x20;
                    auVar29._8_4_ = local_108;
                    auVar29._12_4_ = fVar28;
                    auVar14._4_4_ = fStack_144;
                    auVar14._0_4_ = local_148;
                    auVar14._8_4_ = fStack_140;
                    auVar14._12_4_ = fStack_13c;
                    auVar32 = divps(local_58,auVar14);
                    auVar12._4_8_ = auVar29._8_8_;
                    auVar12._0_4_ = extraout_XMM0_Db_02 * local_58._4_4_;
                    auVar30._0_8_ = auVar12._0_8_ << 0x20;
                    auVar30._8_4_ = local_108 * local_58._8_4_;
                    auVar30._12_4_ = fVar28 * local_58._12_4_;
                    auVar31._8_8_ = auVar30._8_8_;
                    auVar31._0_8_ = auVar32._0_8_;
                    local_188.xmax = (auVar32._0_4_ + (float)(int)uVar23) * (float)local_78._0_4_;
                    local_188.ymax = (auVar32._4_4_ + fStack_44) * (float)local_78._4_4_;
                    auVar8._4_4_ = fStack_44;
                    auVar8._0_4_ = (float)(int)uVar23;
                    auVar8._8_4_ = uStack_40;
                    auVar8._12_4_ = uStack_3c;
                    auVar32 = divps(auVar31,auVar8);
                    fVar28 = auVar32._8_4_ * (float)local_68._8_4_;
                    fVar33 = auVar32._12_4_ * fStack_5c;
                    local_188.xmin = local_188.xmax - fVar28;
                    local_188.ymin = local_188.ymax - fVar33;
                    local_188.xmax = local_188.xmax + fVar28;
                    local_188.ymax = local_188.ymax + fVar33;
                    local_188.area = auVar32._8_4_ * auVar32._12_4_;
                    this_00 = (vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                               *)(local_1a8.
                                  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + local_190);
                    __position._M_current = *(BBoxRect **)(this_00 + 8);
                    local_188.label = iVar22;
                    if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
                      std::
                      vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                      ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                                (this_00,__position,&local_188);
                      pfVar26 = local_98;
                    }
                    else {
                      (__position._M_current)->xmax = local_188.xmax;
                      (__position._M_current)->ymax = local_188.ymax;
                      (__position._M_current)->area = local_188.area;
                      (__position._M_current)->label = iVar22;
                      (__position._M_current)->score = local_f8;
                      (__position._M_current)->xmin = local_188.xmin;
                      (__position._M_current)->ymin = local_188.ymin;
                      (__position._M_current)->xmax = local_188.xmax;
                      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x1c;
                      pfVar26 = local_98;
                    }
                  }
                  pfVar25 = pfVar25 + 1;
                  pfVar21 = pfVar21 + 1;
                  local_120 = local_120 + 1;
                  local_118 = local_118 + 1;
                  pfVar26 = pfVar26 + 1;
                  uVar23 = uVar23 + 1;
                  this = (Yolov3DetectionOutput_x86 *)local_110;
                } while (uVar23 != local_128);
              }
              uVar23 = local_a8 + 1;
            } while (uVar23 != local_b0);
          }
          local_190 = local_190 + 1;
        } while (local_190 < (this->super_Yolov3DetectionOutput).num_box);
      }
      if (0 < (this->super_Yolov3DetectionOutput).num_box) {
        lVar24 = 8;
        lVar27 = 0;
        do {
          std::
          vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
          ::
          _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>>
                    ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                      *)&local_168,
                     local_168.
                     super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     *(undefined8 *)
                      ((long)local_1a8.
                             super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar24 + -8),
                     *(undefined8 *)
                      ((long)&((local_1a8.
                                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar24));
          lVar27 = lVar27 + 1;
          lVar24 = lVar24 + 0x18;
        } while (lVar27 < (this->super_Yolov3DetectionOutput).num_box);
      }
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::~vector(&local_1a8);
      uVar23 = local_138 + 1;
    } while (uVar23 < (ulong)(((long)(local_d0->
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_d0->
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                     _M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x71c71c71c71c71c7));
  }
  Yolov3DetectionOutput::qsort_descent_inplace(&this->super_Yolov3DetectionOutput,&local_168);
  local_188.score = 0.0;
  local_188.xmin = 0.0;
  local_188.ymin = 0.0;
  local_188.xmax = 0.0;
  local_188.ymax = 0.0;
  local_188.area = 0.0;
  Yolov3DetectionOutput::nms_sorted_bboxes
            (&this->super_Yolov3DetectionOutput,&local_168,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188,
             (this->super_Yolov3DetectionOutput).nms_threshold);
  local_1a8.
  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar24 = CONCAT44(local_188.xmin,local_188.score);
  if (CONCAT44(local_188.xmax,local_188.ymin) != lVar24) {
    uVar23 = 0;
    do {
      __args = local_168.
               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
               ._M_impl.super__Vector_impl_data._M_start + *(long *)(lVar24 + uVar23 * 8);
      if (local_1a8.
          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_1a8.
          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
        ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                  ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                    *)&local_1a8,
                   (iterator)
                   local_1a8.
                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,__args);
      }
      else {
        uVar9 = *(undefined8 *)__args;
        uVar13 = *(undefined8 *)&__args->ymin;
        *(undefined1 (*) [16])
         ((long)local_1a8.
                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 0xc) =
             *(undefined1 (*) [16])&__args->xmax;
        *(undefined8 *)
         local_1a8.
         super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish = uVar9;
        *(undefined8 *)
         ((long)local_1a8.
                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 8) = uVar13;
        local_1a8.
        super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((long)local_1a8.
                             super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 0x1c);
      }
      uVar23 = uVar23 + 1;
      lVar24 = CONCAT44(local_188.xmin,local_188.score);
    } while (uVar23 < (ulong)(CONCAT44(local_188.xmax,local_188.ymin) - lVar24 >> 3));
  }
  _h = (int)((long)local_1a8.
                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_1a8.
                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x49249249;
  iVar16 = 0;
  if (_h != 0) {
    this_01 = (local_e0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create(this_01,6,_h,4,local_d8->blob_allocator);
    iVar16 = -100;
    if (((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0)) &&
       (iVar16 = 0, 0 < (int)_h)) {
      iVar22 = this_01->w;
      sVar6 = this_01->elemsize;
      puVar18 = (undefined4 *)((long)this_01->data + 0x14);
      iVar16 = 0;
      lVar24 = 0;
      do {
        uVar2 = *(undefined4 *)
                 ((long)&((local_1a8.
                           super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                         )._M_impl.super__Vector_impl_data._M_start + lVar24);
        puVar18[-5] = (float)*(int *)((long)&local_1a8.
                                             super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[1].
                                             super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar24) +
                      1.0;
        puVar18[-4] = uVar2;
        puVar18[-3] = *(undefined4 *)
                       ((long)&((local_1a8.
                                 super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                               )._M_impl.super__Vector_impl_data._M_start + lVar24 + 4);
        puVar18[-2] = *(undefined4 *)
                       ((long)&((local_1a8.
                                 super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                               )._M_impl.super__Vector_impl_data._M_finish + lVar24);
        puVar18[-1] = *(undefined4 *)
                       ((long)&((local_1a8.
                                 super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                               )._M_impl.super__Vector_impl_data._M_finish + lVar24 + 4);
        *puVar18 = *(undefined4 *)
                    ((long)&((local_1a8.
                              super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                            )._M_impl.super__Vector_impl_data._M_end_of_storage + lVar24);
        lVar24 = lVar24 + 0x1c;
        puVar18 = (undefined4 *)((long)puVar18 + (long)iVar22 * sVar6);
      } while ((ulong)(_h & 0x7fffffff) * 0x1c != lVar24);
    }
  }
  if (local_1a8.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.
                    super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a8.
                          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.
                          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar5 = (void *)CONCAT44(local_188.xmin,local_188.score);
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,CONCAT44(local_188.area,local_188.ymax) - (long)pvVar5);
  }
LAB_00482981:
  if (local_168.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.
                    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar16;
}

Assistant:

int Yolov3DetectionOutput_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
//printf("%d %d\n", net_w, net_h);

//printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            const int cs = (int)scores.cstep;

#if __AVX2__
            const __m256i vi = _mm256_setr_epi32(
                                   0, cs * 1, cs * 2, cs * 3, cs * 4, cs * 5, cs * 6, cs * 7);
#endif

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
#if 0
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }
#else
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    float* ptr = ((float*)scores.data) + i * w + j;
                    float* end = ptr + num_class * cs;
                    int q = 0;
#if __AVX2__
                    float* end8 = ptr + (num_class & -8) * cs;
                    unsigned long index;

                    for (; ptr < end8; ptr += 8 * cs, q += 8)
                    {
                        __m256 p = _mm256_i32gather_ps(ptr, vi, 4);
                        __m256 t = _mm256_max_ps(p, _mm256_permute2f128_ps(p, p, 1));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0x4e));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0xb1));
                        float score = _mm_cvtss_f32(_mm256_extractf128_ps(t, 0));

                        if (score > class_score)
                        {
                            __m256 mi = _mm256_cmp_ps(p, t, _CMP_EQ_OQ);
                            int mask = _mm256_movemask_ps(mi);
#ifdef _MSC_VER
                            BitScanForward(&index, mask);
#else
                            index = __builtin_ctz(mask);
#endif
                            class_index = q + index;
                            class_score = score;
                        }
                    }
#endif

                    for (; ptr < end; ptr += cs, q++)
                    {
                        if (*ptr > class_score)
                        {
                            class_index = q;
                            class_score = *ptr;
                        }
                    }
#endif
                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + expf(-box_score_ptr[0]) * (1.f + expf(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = expf(wptr[0]) * bias_w / net_w;
                        float bbox_h = expf(hptr[0]) * bias_h / net_h;

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = r.label + 1.0f; // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}